

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_Test::testBody
          (TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_Test *this)

{
  UtestShell *pUVar1;
  MemoryLeakDetectorNode *pMVar2;
  TestTerminator *pTVar3;
  undefined1 local_d8 [8];
  MemoryLeakDetectorNode node3;
  MemoryLeakDetectorNode node2;
  MemoryLeakDetectorNode node1;
  MemoryLeakDetectorList listForTesting;
  TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_Test *this_local;
  
  MemoryLeakDetectorList::MemoryLeakDetectorList((MemoryLeakDetectorList *)&node1.next_);
  MemoryLeakDetectorNode::MemoryLeakDetectorNode((MemoryLeakDetectorNode *)&node2.next_);
  MemoryLeakDetectorNode::MemoryLeakDetectorNode((MemoryLeakDetectorNode *)&node3.next_);
  MemoryLeakDetectorNode::MemoryLeakDetectorNode((MemoryLeakDetectorNode *)local_d8);
  node3.allocator_._0_4_ = 1;
  MemoryLeakDetectorList::addNewNode
            ((MemoryLeakDetectorList *)&node1.next_,(MemoryLeakDetectorNode *)&node2.next_);
  MemoryLeakDetectorList::addNewNode
            ((MemoryLeakDetectorList *)&node1.next_,(MemoryLeakDetectorNode *)&node3.next_);
  MemoryLeakDetectorList::addNewNode
            ((MemoryLeakDetectorList *)&node1.next_,(MemoryLeakDetectorNode *)local_d8);
  MemoryLeakDetectorList::clearAllAccounting
            ((MemoryLeakDetectorList *)&node1.next_,mem_leak_period_enabled);
  pUVar1 = UtestShell::getCurrent();
  pMVar2 = MemoryLeakDetectorList::getFirstLeak
                     ((MemoryLeakDetectorList *)&node1.next_,mem_leak_period_enabled);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,0,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x230,pTVar3);
  pUVar1 = UtestShell::getCurrent();
  pMVar2 = MemoryLeakDetectorList::getFirstLeak
                     ((MemoryLeakDetectorList *)&node1.next_,mem_leak_period_disabled);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)((MemoryLeakDetectorNode *)local_d8 == pMVar2),"CHECK",
             "&node3 == listForTesting.getFirstLeak(mem_leak_period_disabled)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x231,pTVar3);
  return;
}

Assistant:

TEST(MemoryLeakDetectorListTest, clearAllAccountingIsWorkingProperly)
{
    MemoryLeakDetectorList listForTesting;
    MemoryLeakDetectorNode node1, node2, node3;
    node3.period_ = mem_leak_period_disabled;
    listForTesting.addNewNode(&node1);
    listForTesting.addNewNode(&node2);
    listForTesting.addNewNode(&node3);

    listForTesting.clearAllAccounting(mem_leak_period_enabled);

    POINTERS_EQUAL(NULLPTR, listForTesting.getFirstLeak(mem_leak_period_enabled));
    CHECK(&node3 == listForTesting.getFirstLeak(mem_leak_period_disabled));
}